

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O0

set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
* __thiscall CriticalSectionsBuilder::locks(CriticalSectionsBuilder *this)

{
  bool bVar1;
  reference ppVar2;
  long in_RSI;
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_llvm::CallInst_*>,_bool> pVar3;
  pair<const_llvm::CallInst_*const,_CriticalSection_*> lock;
  const_iterator __end1;
  const_iterator __begin1;
  map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
  *__range1;
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  *llvmLocks;
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  *this_00;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  _Self local_30;
  _Self local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::
  set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
  ::set((set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
         *)0x1af2ce);
  local_20 = in_RSI + 200;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
       ::begin((map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
                *)in_RDI);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
       ::end((map<const_llvm::CallInst_*,_CriticalSection_*,_std::less<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>_>
              *)in_RDI);
  while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>::
             operator*((_Rb_tree_const_iterator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>
                        *)0x1af31b);
    pVar3 = std::
            set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
            ::insert((set<const_llvm::CallInst_*,_std::less<const_llvm::CallInst_*>,_std::allocator<const_llvm::CallInst_*>_>
                      *)ppVar2->first,
                     (value_type *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffb8 = pVar3.second;
    std::_Rb_tree_const_iterator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>::
    operator++((_Rb_tree_const_iterator<std::pair<const_llvm::CallInst_*const,_CriticalSection_*>_>
                *)this_00);
  }
  return this_00;
}

Assistant:

std::set<const llvm::CallInst *> CriticalSectionsBuilder::locks() const {
    std::set<const llvm::CallInst *> llvmLocks;

    for (auto lock : criticalSections_) {
        llvmLocks.insert(lock.first);
    }
    return llvmLocks;
}